

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O1

size_t dictionary_text_get_lexicon(dictionary_t t_dictionary,entry *lexicon)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  text_dictionary_desc *text_dictionary;
  size_t sVar4;
  
  sVar4 = *t_dictionary;
  sVar2 = sVar4;
  if (sVar4 != 0) {
    lVar1 = *(long *)((long)t_dictionary + 0x10);
    lVar3 = 8;
    do {
      *(undefined8 *)((long)lexicon + lVar3 + -8) = *(undefined8 *)(lVar1 + -8 + lVar3);
      *(undefined8 *)((long)&lexicon->key + lVar3) = *(undefined8 *)(lVar1 + lVar3);
      lVar3 = lVar3 + 0x10;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  return sVar2;
}

Assistant:

size_t dictionary_text_get_lexicon(dictionary_t t_dictionary, entry * lexicon)
{
	text_dictionary_desc * text_dictionary = (text_dictionary_desc *) t_dictionary;

	size_t i;
	for (i = 0; i < text_dictionary->entry_count; i ++)
	{
		lexicon[i].key = text_dictionary->lexicon[i].key;
		lexicon[i].value = text_dictionary->lexicon[i].value;
	}

	return text_dictionary->entry_count;
}